

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O1

region * __thiscall
toml::detail::syntax::non_ascii_key_char::scan
          (region *__return_storage_ptr__,non_ascii_key_char *this,location *loc)

{
  element_type *peVar1;
  size_t sVar2;
  size_t sVar3;
  uint32_t uVar4;
  undefined4 uVar5;
  location *plVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  location first;
  location local_60;
  
  peVar1 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if ((ulong)((long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start) <= loc->location_) {
    region::region(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  location::location(&local_60,loc);
  plVar6 = loc;
  uVar4 = read_utf8(this,loc);
  if ((uVar4 - 0xb2 < 8) && ((0x83U >> (uVar4 - 0xb2 & 0x1f) & 1) != 0)) {
LAB_0039b43d:
    (__return_storage_ptr__->source_).
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = local_60.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (__return_storage_ptr__->source_).
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         local_60.source_.
         super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if (local_60.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_60.source_.
         super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_60.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_60.source_.
         super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_60.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    (__return_storage_ptr__->source_name_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->source_name_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->source_name_,
               local_60.source_name_._M_dataplus._M_p,
               local_60.source_name_._M_dataplus._M_p + local_60.source_name_._M_string_length);
    __return_storage_ptr__->first_ = local_60.location_;
    __return_storage_ptr__->first_line_ = local_60.line_number_;
    __return_storage_ptr__->first_column_ = local_60.column_number_;
    sVar2 = loc->location_;
    sVar3 = loc->line_number_;
    __return_storage_ptr__->length_ = sVar2 - local_60.location_;
    __return_storage_ptr__->last_ = sVar2;
    __return_storage_ptr__->last_line_ = sVar3;
    __return_storage_ptr__->last_column_ = loc->column_number_;
  }
  else {
    if (uVar4 != 0xffffffff) {
      auVar9._0_4_ = -(uint)(-0x7fffe380 < (int)(uVar4 - 0x37f ^ 0x80000000));
      auVar9._4_4_ = -(uint)(-0x7fffffff < (int)(uVar4 - 0x203f ^ 0x80000000));
      auVar9._8_4_ = -(uint)(-0x7ffffee1 < (int)(uVar4 - 0x2070 ^ 0x80000000));
      auVar9._12_4_ = -(uint)(-0x7fffff61 < (int)(uVar4 - 0x2460 ^ 0x80000000));
      auVar8._0_4_ = -(uint)(-0x7ffffffe < (int)(uVar4 - 0xbc ^ 0x80000000));
      auVar8._4_4_ = -(uint)(-0x7fffffea < (int)(uVar4 - 0xc0 ^ 0x80000000));
      auVar8._8_4_ = -(uint)(-0x7fffffe2 < (int)(uVar4 - 0xd8 ^ 0x80000000));
      auVar8._12_4_ = -(uint)(-0x7ffffd7b < (int)(uVar4 - 0xf8 ^ 0x80000000));
      auVar7 = packssdw(auVar8,auVar9);
      auVar8 = packsswb(auVar7,auVar7);
      auVar7._0_4_ = -(uint)(-0x7ffffc11 < (int)(uVar4 - 0x2c00 ^ 0x80000000));
      auVar7._4_4_ = -(uint)(-0x7fff5802 < (int)(uVar4 - 0x3001 ^ 0x80000000));
      auVar7._8_4_ = -(uint)(-0x7ffffb31 < (int)(uVar4 - 0xf900 ^ 0x80000000));
      auVar7._12_4_ = -(uint)(-0x7ffffdf3 < (int)(uVar4 - 0xfdf0 ^ 0x80000000));
      uVar5 = movmskps((int)plVar6,auVar7);
      if ((((char)uVar5 != '\x0f' ||
           (byte)(SUB161(auVar8 >> 7,0) & 1 | (SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                  (SUB161(auVar8 >> 0x17,0) & 1) << 2 | (SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                  (SUB161(auVar8 >> 0x27,0) & 1) << 4 | (SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                  (SUB161(auVar8 >> 0x37,0) & 1) << 6 | SUB161(auVar8 >> 0x3f,0) << 7) != 0xff) ||
          uVar4 - 0x10000 < 0xe0000) || (uVar4 & 0xfffffffe) == 0x200c) goto LAB_0039b43d;
      (loc->source_).
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = local_60.source_.
                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(loc->source_).
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 &local_60.source_.
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_assign(&loc->source_name_,&local_60.source_name_);
      loc->column_number_ = local_60.column_number_;
      loc->location_ = local_60.location_;
      loc->line_number_ = local_60.line_number_;
    }
    region::region(__return_storage_ptr__);
  }
  location::~location(&local_60);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE region non_ascii_key_char::scan(location& loc) const
{
    if(loc.eof()) {return region{};}

    const auto first = loc;

    const auto cp = read_utf8(loc);

    if(cp == 0xFFFFFFFF)
    {
        return region{};
    }

    // ALPHA / DIGIT / %x2D / %x5F    ; a-z A-Z 0-9 - _
    // / %xB2 / %xB3 / %xB9 / %xBC-BE ; superscript digits, fractions
    // / %xC0-D6 / %xD8-F6 / %xF8-37D ; non-symbol chars in Latin block
    // / %x37F-1FFF                   ; exclude GREEK QUESTION MARK, which is basically a semi-colon
    // / %x200C-200D / %x203F-2040    ; from General Punctuation Block, include the two tie symbols and ZWNJ, ZWJ
    // / %x2070-218F / %x2460-24FF    ; include super-/subscripts, letterlike/numberlike forms, enclosed alphanumerics
    // / %x2C00-2FEF / %x3001-D7FF    ; skip arrows, math, box drawing etc, skip 2FF0-3000 ideographic up/down markers and spaces
    // / %xF900-FDCF / %xFDF0-FFFD    ; skip D800-DFFF surrogate block, E000-F8FF Private Use area, FDD0-FDEF intended for process-internal use (unicode)
    // / %x10000-EFFFF                ; all chars outside BMP range, excluding Private Use planes (F0000-10FFFF)

    if(cp == 0xB2 || cp == 0xB3 || cp == 0xB9 || (0xBC <= cp && cp <= 0xBE) ||
       (0xC0    <= cp && cp <= 0xD6  ) || (0xD8 <= cp && cp <= 0xF6) || (0xF8 <= cp && cp <= 0x37D) ||
       (0x37F   <= cp && cp <= 0x1FFF) ||
       (0x200C  <= cp && cp <= 0x200D) || (0x203F <= cp && cp <= 0x2040) ||
       (0x2070  <= cp && cp <= 0x218F) || (0x2460 <= cp && cp <= 0x24FF) ||
       (0x2C00  <= cp && cp <= 0x2FEF) || (0x3001 <= cp && cp <= 0xD7FF) ||
       (0xF900  <= cp && cp <= 0xFDCF) || (0xFDF0 <= cp && cp <= 0xFFFD) ||
       (0x10000 <= cp && cp <= 0xEFFFF) )
    {
        return region(first, loc);
    }
    loc = first;
    return region{};
}